

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void x25519_ge_p1p1_to_p3(ge_p3 *r,ge_p1p1 *p)

{
  fe_mul_impl((fe_limb_t *)r,(fe_limb_t *)p,(p->T).v);
  fe_mul_impl((r->Y).v,(p->Y).v,(p->Z).v);
  fe_mul_impl((r->Z).v,(p->Z).v,(p->T).v);
  fe_mul_impl((r->T).v,(fe_limb_t *)p,(p->Y).v);
  return;
}

Assistant:

void x25519_ge_p1p1_to_p3(ge_p3 *r, const ge_p1p1 *p) {
  fe_mul_tll(&r->X, &p->X, &p->T);
  fe_mul_tll(&r->Y, &p->Y, &p->Z);
  fe_mul_tll(&r->Z, &p->Z, &p->T);
  fe_mul_tll(&r->T, &p->X, &p->Y);
}